

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQChar * __thiscall SQSharedState::GetScratchPad(SQSharedState *this,SQInteger size)

{
  long lVar1;
  void *pvVar2;
  long in_RSI;
  void *in_RDI;
  SQInteger newsize;
  SQUnsignedInteger in_stack_ffffffffffffffd8;
  
  if (0 < in_RSI) {
    if (*(long *)((long)in_RDI + 0x178) < in_RSI) {
      pvVar2 = sq_vm_realloc(in_RDI,in_stack_ffffffffffffffd8,0x13f9b9);
      *(void **)((long)in_RDI + 0x170) = pvVar2;
      *(long *)((long)in_RDI + 0x178) = in_RSI + (in_RSI >> 1);
    }
    else if (in_RSI * 0x20 <= *(long *)((long)in_RDI + 0x178)) {
      lVar1 = *(long *)((long)in_RDI + 0x178);
      pvVar2 = sq_vm_realloc(in_RDI,in_stack_ffffffffffffffd8,0x13fa1c);
      *(void **)((long)in_RDI + 0x170) = pvVar2;
      *(long *)((long)in_RDI + 0x178) = lVar1 >> 1;
    }
  }
  return *(SQChar **)((long)in_RDI + 0x170);
}

Assistant:

SQChar* SQSharedState::GetScratchPad(SQInteger size)
{
    SQInteger newsize;
    if(size>0) {
        if(_scratchpadsize < size) {
            newsize = size + (size>>1);
            _scratchpad = (SQChar *)SQ_REALLOC(_scratchpad,_scratchpadsize,newsize);
            _scratchpadsize = newsize;

        }else if(_scratchpadsize >= (size<<5)) {
            newsize = _scratchpadsize >> 1;
            _scratchpad = (SQChar *)SQ_REALLOC(_scratchpad,_scratchpadsize,newsize);
            _scratchpadsize = newsize;
        }
    }
    return _scratchpad;
}